

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::invokeLambda<bool,Catch::makeCommandLineParser(Catch::ConfigData&)::__4>
          (anon_class_8_1_50637480_for_m_lambda *lambda,string *arg)

{
  bool bVar1;
  BasicResult<Catch::clara::detail::ParseResultType> *in_RDI;
  ParserResult result;
  bool temp;
  BasicResult<Catch::clara::detail::ParseResultType> *pBVar2;
  BasicResult<Catch::clara::detail::ParseResultType> *in_stack_ffffffffffffffa0;
  anon_class_8_1_50637480_for_m_lambda *in_stack_ffffffffffffffa8;
  BasicResult local_50 [55];
  undefined1 local_19;
  
  local_19 = 0;
  pBVar2 = in_RDI;
  convertInto((string *)result.m_errorMessage.field_2._M_allocated_capacity,
              (bool *)result.m_errorMessage._M_string_length);
  bVar1 = BasicResult::operator_cast_to_bool(local_50);
  if (bVar1) {
    LambdaInvoker<void>::invoke<Catch::makeCommandLineParser(Catch::ConfigData&)::__4,bool>
              (in_stack_ffffffffffffffa8,(bool *)in_stack_ffffffffffffffa0);
  }
  else {
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (in_stack_ffffffffffffffa0,pBVar2);
  }
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(in_RDI);
  return pBVar2;
}

Assistant:

inline auto invokeLambda( L const &lambda, std::string const &arg ) -> ParserResult {
        ArgType temp{};
        auto result = convertInto( arg, temp );
        return !result
           ? result
           : LambdaInvoker<typename UnaryLambdaTraits<L>::ReturnType>::invoke( lambda, temp );
    }